

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  sqlite3 *db;
  Schema *pSVar1;
  Schema *pSVar2;
  uint uVar3;
  SrcList *pSVar4;
  char *pcVar5;
  Schema **ppSVar6;
  
  db = pParse->db;
  pSVar4 = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSVar4 != (SrcList *)0x0) {
    pcVar5 = sqlite3DbStrDup(db,pStep->zTarget);
    pSVar4->a[(long)pSVar4->nSrc + -1].zName = pcVar5;
    pSVar1 = pStep->pTrig->pSchema;
    if (pSVar1 == (Schema *)0x0) {
      uVar3 = 0xfff0bdc0;
    }
    else {
      uVar3 = 0xffffffff;
      ppSVar6 = &db->aDb->pSchema;
      do {
        uVar3 = uVar3 + 1;
        pSVar2 = *ppSVar6;
        ppSVar6 = ppSVar6 + 4;
      } while (pSVar2 != pSVar1);
    }
    if (uVar3 == 0 || 1 < (int)uVar3) {
      pcVar5 = sqlite3DbStrDup(db,db->aDb[uVar3].zDbSName);
      pSVar4->a[(long)pSVar4->nSrc + -1].zDatabase = pcVar5;
    }
  }
  return pSVar4;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  sqlite3 *db = pParse->db;
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    pSrc->a[pSrc->nSrc-1].zName = sqlite3DbStrDup(db, pStep->zTarget);
    iDb = sqlite3SchemaToIndex(db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      const char *zDb;
      assert( iDb<db->nDb );
      zDb = db->aDb[iDb].zDbSName;
      pSrc->a[pSrc->nSrc-1].zDatabase =  sqlite3DbStrDup(db, zDb);
    }
  }
  return pSrc;
}